

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

void FAudioVoice_GetOutputFilterParameters
               (FAudioVoice *voice,FAudioVoice *pDestinationVoice,
               FAudioFilterParameters *pParameters)

{
  FAudioSendDescriptor *pFVar1;
  uint uVar2;
  ulong uVar3;
  FAudioVoice **ppFVar4;
  
  if (voice->type == FAUDIO_VOICE_MASTER) {
    return;
  }
  FAudio_PlatformLockMutex(voice->sendLock);
  uVar2 = (voice->sends).SendCount;
  if (uVar2 == 1 && pDestinationVoice == (FAudioVoice *)0x0) {
    pDestinationVoice = ((voice->sends).pSends)->pOutputVoice;
    uVar2 = 1;
  }
  else if (uVar2 == 0) goto LAB_00115c74;
  pFVar1 = (voice->sends).pSends;
  ppFVar4 = &pFVar1->pOutputVoice;
  uVar3 = 0;
  do {
    if (pDestinationVoice == *ppFVar4) {
      if ((pFVar1[uVar3 & 0xffffffff].Flags & 0x80) != 0) {
        SDL_memcpy(pParameters,voice->sendFilter + (uVar3 & 0xffffffff),0xc);
      }
      break;
    }
    uVar3 = uVar3 + 1;
    ppFVar4 = (FAudioVoice **)((long)ppFVar4 + 0xc);
  } while (uVar2 != uVar3);
LAB_00115c74:
  FAudio_PlatformUnlockMutex(voice->sendLock);
  return;
}

Assistant:

void FAudioVoice_GetOutputFilterParameters(
	FAudioVoice *voice,
	FAudioVoice *pDestinationVoice,
	FAudioFilterParameters *pParameters
) {
	uint32_t i;

	LOG_API_ENTER(voice->audio)

	/* MSDN: "This method is usable only on source and submix voices and
	 * has no effect on mastering voices."
	 */
	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	/* Find the send index */
	if (pDestinationVoice == NULL && voice->sends.SendCount == 1)
	{
		pDestinationVoice = voice->sends.pSends[0].pOutputVoice;
	}
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		if (pDestinationVoice == voice->sends.pSends[i].pOutputVoice)
		{
			break;
		}
	}
	if (i >= voice->sends.SendCount)
	{
		LOG_ERROR(
			voice->audio,
			"Destination not attached to source: %p %p",
			(void*) voice,
			(void*) pDestinationVoice
		)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return;
	}

	if (!(voice->sends.pSends[i].Flags & FAUDIO_SEND_USEFILTER))
	{
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return;
	}

	/* Set the filter parameters, finally. */
	FAudio_memcpy(
		pParameters,
		&voice->sendFilter[i],
		sizeof(FAudioFilterParameters)
	);

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
}